

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O1

int LogLuvDecode32(TIFF *tif,uint8_t *op,tmsize_t occ,uint16_t s)

{
  byte bVar1;
  uint8_t *puVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  undefined6 in_register_0000000a;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint8_t *p;
  byte *pbVar9;
  bool bVar10;
  
  if ((int)CONCAT62(in_register_0000000a,s) != 0) {
    __assert_fail("s == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x146,"int LogLuvDecode32(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  puVar2 = tif->tif_data;
  if (puVar2 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x148,"int LogLuvDecode32(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  lVar3 = occ / (long)*(int *)(puVar2 + 0xc);
  p = op;
  if (*(int *)(puVar2 + 4) != 2) {
    if (*(long *)(puVar2 + 0x18) < lVar3) {
      TIFFErrorExtR(tif,"LogLuvDecode32","Translation buffer too short");
      return 0;
    }
    p = *(uint8_t **)(puVar2 + 0x10);
  }
  _TIFFmemset(p,0,lVar3 * 4);
  pbVar9 = tif->tif_rawcp;
  lVar8 = tif->tif_rawcc;
  iVar5 = 0x18;
  while ((lVar3 < 1 || (lVar8 < 1))) {
    lVar4 = 0;
LAB_002ac470:
    if (lVar3 != lVar4) {
      TIFFErrorExtR(tif,"LogLuvDecode32","Not enough data at row %u (short %ld pixels)",
                    (ulong)tif->tif_row);
      tif->tif_rawcp = pbVar9;
      tif->tif_rawcc = lVar8;
      return 0;
    }
    bVar10 = iVar5 == 0;
    iVar5 = iVar5 + -8;
    if (bVar10) {
      (**(code **)(puVar2 + 0x20))(puVar2,op,lVar3);
      tif->tif_rawcp = pbVar9;
      tif->tif_rawcc = lVar8;
      return 1;
    }
  }
  lVar4 = 0;
  do {
    uVar6 = (uint)*pbVar9;
    if ((char)*pbVar9 < '\0') {
      if (lVar8 < 2) goto LAB_002ac470;
      bVar1 = pbVar9[1];
      pbVar9 = pbVar9 + 2;
      lVar8 = lVar8 + -2;
      if ((uVar6 != 0x7e) && (lVar4 < lVar3)) {
        iVar7 = uVar6 - 0x7f;
        do {
          *(uint *)(p + lVar4 * 4) = *(uint *)(p + lVar4 * 4) | (uint)bVar1 << ((byte)iVar5 & 0x1f);
          lVar4 = lVar4 + 1;
          bVar10 = iVar7 == 0;
          iVar7 = iVar7 + -1;
          if (bVar10) break;
        } while (lVar4 < lVar3);
      }
    }
    else {
      while( true ) {
        pbVar9 = pbVar9 + 1;
        lVar8 = lVar8 + -1;
        if (lVar8 == 0) break;
        bVar10 = uVar6 == 0;
        uVar6 = uVar6 - 1;
        if ((bVar10) || (lVar3 <= lVar4)) goto LAB_002ac42c;
        *(uint *)(p + lVar4 * 4) = *(uint *)(p + lVar4 * 4) | (uint)*pbVar9 << ((byte)iVar5 & 0x1f);
        lVar4 = lVar4 + 1;
      }
      lVar8 = 0;
    }
LAB_002ac42c:
    if ((lVar3 <= lVar4) || (lVar8 < 1)) goto LAB_002ac470;
  } while( true );
}

Assistant:

static int LogLuvDecode32(TIFF *tif, uint8_t *op, tmsize_t occ, uint16_t s)
{
    static const char module[] = "LogLuvDecode32";
    LogLuvState *sp;
    int shft;
    tmsize_t i;
    tmsize_t npixels;
    unsigned char *bp;
    uint32_t *tp;
    uint32_t b;
    tmsize_t cc;
    int rc;

    (void)s;
    assert(s == 0);
    sp = DecoderState(tif);
    assert(sp != NULL);

    npixels = occ / sp->pixel_size;

    if (sp->user_datafmt == SGILOGDATAFMT_RAW)
        tp = (uint32_t *)op;
    else
    {
        if (sp->tbuflen < npixels)
        {
            TIFFErrorExtR(tif, module, "Translation buffer too short");
            return (0);
        }
        tp = (uint32_t *)sp->tbuf;
    }
    _TIFFmemset((void *)tp, 0, npixels * sizeof(tp[0]));

    bp = (unsigned char *)tif->tif_rawcp;
    cc = tif->tif_rawcc;
    /* get each byte string */
    for (shft = 24; shft >= 0; shft -= 8)
    {
        for (i = 0; i < npixels && cc > 0;)
        {
            if (*bp >= 128)
            { /* run */
                if (cc < 2)
                    break;
                rc = *bp++ + (2 - 128);
                b = (uint32_t)*bp++ << shft;
                cc -= 2;
                while (rc-- && i < npixels)
                    tp[i++] |= b;
            }
            else
            {               /* non-run */
                rc = *bp++; /* nul is noop */
                while (--cc && rc-- && i < npixels)
                    tp[i++] |= (uint32_t)*bp++ << shft;
            }
        }
        if (i != npixels)
        {
            TIFFErrorExtR(tif, module,
                          "Not enough data at row %" PRIu32
                          " (short %" TIFF_SSIZE_FORMAT " pixels)",
                          tif->tif_row, npixels - i);
            tif->tif_rawcp = (uint8_t *)bp;
            tif->tif_rawcc = cc;
            return (0);
        }
    }
    (*sp->tfunc)(sp, op, npixels);
    tif->tif_rawcp = (uint8_t *)bp;
    tif->tif_rawcc = cc;
    return (1);
}